

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pairing_lcl.h
# Opt level: O0

void fp2_square(fp2_struct_st *rop,fp2_struct_st *op,ATE_CTX *ctx)

{
  long in_RDX;
  long in_RSI;
  long in_RDI;
  fp_t tmp3;
  fp_t tmp2;
  fp_t tmp1;
  fp_struct_st *in_stack_ffffffffffffff88;
  fp_struct_st *in_stack_ffffffffffffff90;
  fp_struct_st *in_stack_ffffffffffffff98;
  fp_struct_st *in_stack_ffffffffffffffa0;
  undefined1 local_58 [32];
  undefined1 local_38 [32];
  long local_18;
  long local_10;
  long local_8;
  
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  fp_mul(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,in_stack_ffffffffffffff90,
         in_stack_ffffffffffffff88,(fp_struct_st *)0x128693);
  fp_add(local_58,local_10,local_10 + 0x20,local_18 + 0x2d0);
  fp_double(&stack0xffffffffffffff88,local_10,local_18 + 0x2d0);
  fp_sub(local_8 + 0x20,local_10 + 0x20,&stack0xffffffffffffff88,local_18 + 0x2d0);
  fp_mul(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,in_stack_ffffffffffffff90,
         in_stack_ffffffffffffff88,(fp_struct_st *)0x12872a);
  fp_sub(local_8 + 0x20,local_8 + 0x20,local_38,local_18 + 0x2d0);
  fp_double(local_58,local_38,local_18 + 0x2d0);
  fp_add(local_8 + 0x20,local_8 + 0x20,local_58,local_18 + 0x2d0);
  fp_double(local_8,local_38,local_18 + 0x2d0);
  return;
}

Assistant:

static gml_inline void fp2_square(fp2_t rop, const fp2_t op, const ATE_CTX *ctx)
{
    fp_t tmp1, tmp2, tmp3; // Needed for intermediary results
// static int nnn2=0;
// nnn2++;
// printf("%d\n",nnn2);
    fp_mul(tmp1, op->m_a, op->m_b, ctx->p, ctx->n0);

    fp_add(tmp2, op->m_a, op->m_b, ctx->p);
// #if(ALPHA == 2)
//     fp_double(tmp3, op->m_a, ctx->p);
//     fp_add(rop->m_b, op->m_b, tmp3, ctx->p);
// #elif(ALPHA == -2)
    fp_double(tmp3, op->m_a, ctx->p);
	// fp_print(op->m_b, ctx);
	// fp_print(tmp3, ctx);
    // printf("%lx,\n",ctx->p->d[0]);
    // printf("%lx,\n",ctx->p->d[1]);
    // printf("%lx,\n",ctx->p->d[2]);
    // printf("%lx,\n",ctx->p->d[3]);
    fp_sub(rop->m_b, op->m_b, tmp3, ctx->p);
	// fp_print(rop->m_b, ctx);
// #elif(ALPHA == -1)
//     fp_sub(rop->m_b, op->m_b, op->m_a, ctx->p);
// #else
// #error "ALPHA must be -1, 2 or -2"
// #endif
    fp_mul(rop->m_b, rop->m_b, tmp2, ctx->p, ctx->n0);

    fp_sub(rop->m_b, rop->m_b, tmp1, ctx->p);
// #if(ALPHA == 2)
//     fp_double(tmp2, tmp1, ctx->p);
//     fp_sub(rop->m_b, rop->m_b, tmp2, ctx->p);
// #elif(ALPHA == -2)
    fp_double(tmp2, tmp1, ctx->p);
    fp_add(rop->m_b, rop->m_b, tmp2, ctx->p);
// #elif(ALPHA == -1)
//     fp_add(rop->m_b, rop->m_b, tmp1, ctx->p);
// #else
// #error "ALPHA must be -1, 2 or -2"
// #endif

    fp_double(rop->m_a, tmp1, ctx->p);
}